

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

void __thiscall agr::savebuf::savebuf(savebuf *this,streambuf *sbuf)

{
  streambuf *sbuf_local;
  savebuf *this_local;
  
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__savebuf_00104d30;
  this->sbuf = sbuf;
  std::__cxx11::string::string((string *)&this->save);
  return;
}

Assistant:

savebuf::savebuf( std::streambuf* sbuf ): 
   sbuf( sbuf ) 
   {}